

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O2

LatticeComparison __thiscall
wasm::analysis::Flat<bool>::compare(Flat<bool> *this,Element *a,Element *b)

{
  byte bVar1;
  byte bVar2;
  LatticeComparison LVar3;
  
  bVar1 = *(__index_type *)
           ((long)&(a->
                   super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   ).
                   super__Variant_base<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Move_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Copy_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Move_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Copy_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Variant_storage_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
           + 1);
  bVar2 = *(__index_type *)
           ((long)&(b->
                   super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   ).
                   super__Variant_base<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Move_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Copy_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Move_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Copy_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                   .
                   super__Variant_storage_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
           + 1);
  if (bVar1 < bVar2) {
    LVar3 = LESS;
  }
  else if (bVar2 < bVar1) {
    LVar3 = GREATER;
  }
  else if ((bVar1 != 1) ||
          (LVar3 = NO_RELATION,
          *(char *)&(a->
                    super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                    ).
                    super__Variant_base<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                    .
                    super__Move_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                    .
                    super__Copy_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                    .
                    super__Move_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                    .
                    super__Copy_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                    .
                    super__Variant_storage_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
          == *(char *)&(b->
                       super_variant<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                       ).
                       super__Variant_base<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                       .
                       super__Move_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                       .
                       super__Copy_assign_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                       .
                       super__Move_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                       .
                       super__Copy_ctor_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
                       .
                       super__Variant_storage_alias<wasm::analysis::Flat<bool>::Bot,_bool,_wasm::analysis::Flat<bool>::Top>
          )) {
    LVar3 = EQUAL;
  }
  return LVar3;
}

Assistant:

LatticeComparison compare(const Element& a, const Element& b) const noexcept {
    if (a.index() < b.index()) {
      return LESS;
    } else if (a.index() > b.index()) {
      return GREATER;
    } else if (auto pA = a.getVal(); pA && *pA != *b.getVal()) {
      return NO_RELATION;
    } else {
      return EQUAL;
    }
  }